

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t skip_lws(scanner_t *scanner)

{
  undefined8 uVar1;
  bool bVar2;
  int matched;
  size_t save_pos;
  parse_status_t status;
  token_type_t tok_type;
  memptr token;
  scanner_t *scanner_local;
  
  token.length = (size_t)scanner;
  do {
    uVar1 = *(undefined8 *)(token.length + 8);
    bVar2 = false;
    save_pos._0_4_ =
         scanner_get_token((scanner_t *)token.length,(memptr *)&status,
                           (token_type_t *)((long)&save_pos + 4));
    if ((parse_status_t)save_pos == PARSE_OK) {
      if (save_pos._4_4_ == 2) {
        save_pos._0_4_ =
             scanner_get_token((scanner_t *)token.length,(memptr *)&status,
                               (token_type_t *)((long)&save_pos + 4));
      }
      if (((parse_status_t)save_pos == PARSE_OK) && (save_pos._4_4_ == 1)) {
        bVar2 = true;
      }
      else {
        *(undefined8 *)(token.length + 8) = uVar1;
      }
    }
  } while (bVar2);
  if (((parse_status_t)save_pos == PARSE_INCOMPLETE) && (*(int *)(token.length + 0x10) != 0)) {
    save_pos._0_4_ = PARSE_OK;
  }
  return (parse_status_t)save_pos;
}

Assistant:

static UPNP_INLINE parse_status_t skip_lws(scanner_t *scanner)
{
	memptr token;
	token_type_t tok_type;
	parse_status_t status;
	size_t save_pos;
	int matched;

	do {
		save_pos = scanner->cursor;
		matched = 0;

		/* get CRLF or WS */
		status = scanner_get_token(scanner, &token, &tok_type);
		if (status == (parse_status_t)PARSE_OK) {
			if (tok_type == (token_type_t)TT_CRLF) {
				/* get WS */
				status = scanner_get_token(
					scanner, &token, &tok_type);
			}

			if (status == (parse_status_t)PARSE_OK &&
				tok_type == (token_type_t)TT_WHITESPACE) {
				matched = 1;
			} else {
				/* did not match LWS; pushback token(s) */
				scanner->cursor = save_pos;
			}
		}
	} while (matched);

	/* if entire msg is loaded, ignore an 'incomplete' warning */
	if (status == (parse_status_t)PARSE_INCOMPLETE &&
		scanner->entire_msg_loaded) {
		status = PARSE_OK;
	}

	return status;
}